

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O1

void __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::flip_x
          (image<crnlib::color_quad<unsigned_char,_int>_> *this)

{
  uint uVar1;
  uint uVar2;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 aVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  if (this->m_height != 0) {
    uVar2 = this->m_width;
    uVar5 = 0;
    do {
      if (1 < uVar2) {
        uVar6 = 0;
        iVar7 = -1;
        do {
          pcVar4 = this->m_pPixels;
          iVar8 = this->m_pitch * uVar5;
          uVar1 = uVar6 + iVar8;
          aVar3 = pcVar4[uVar1].field_0;
          uVar9 = iVar8 + this->m_width + iVar7;
          pcVar4[uVar1].field_0.field_0.r = pcVar4[uVar9].field_0.field_0.r;
          pcVar4[uVar1].field_0.field_0.g = pcVar4[uVar9].field_0.field_0.g;
          pcVar4[uVar1].field_0.field_0.b = pcVar4[uVar9].field_0.field_0.b;
          pcVar4[uVar1].field_0.field_0.a = pcVar4[uVar9].field_0.field_0.a;
          this->m_pPixels[this->m_pitch * uVar5 + this->m_width + iVar7].field_0 = aVar3;
          uVar6 = uVar6 + 1;
          iVar7 = iVar7 + -1;
        } while (uVar2 >> 1 != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_height);
  }
  return;
}

Assistant:

void flip_x()
        {
            const uint half_width = m_width / 2;
            for (uint y = 0; y < m_height; y++)
            {
                for (uint x = 0; x < half_width; x++)
                {
                    color_type c((*this)(x, y));
                    (*this)(x, y) = (*this)(m_width - 1 - x, y);
                    (*this)(m_width - 1 - x, y) = c;
                }
            }
        }